

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O0

bool Diligent::IsDXILBytecode(void *pBytecode,size_t Size)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  char (*in_stack_ffffffffffffff68) [13];
  code *pcVar4;
  DxilPartHeader *PartHeader;
  uint32_t Offset;
  uint32_t part;
  uint32_t *PartOffsets;
  char local_68 [4];
  uint local_64;
  undefined1 local_60 [8];
  string _msg;
  DxilContainerHeader *ContainerHeader;
  uint8_t *ptr;
  uint8_t *data_end;
  uint8_t *data_begin;
  size_t Size_local;
  void *pBytecode_local;
  
  uVar2 = (long)pBytecode + Size;
  if (((long)pBytecode + 0x20U <= uVar2) && (*pBytecode == 0x43425844)) {
    if (*(short *)((long)pBytecode + 0x14) == 1) {
      if ((long)pBytecode + (ulong)*(uint *)((long)pBytecode + 0x1c) * 4 + 0x20 <= uVar2) {
        for (PartHeader._4_4_ = 0; PartHeader._4_4_ < *(uint *)((long)pBytecode + 0x1c);
            PartHeader._4_4_ = PartHeader._4_4_ + 1) {
          uVar1 = *(uint *)((long)pBytecode + (ulong)PartHeader._4_4_ * 4 + 0x20);
          if (uVar2 < (long)pBytecode + (ulong)uVar1 + 8) {
            return false;
          }
          if (*(int *)((long)pBytecode + (ulong)uVar1) == 0x4c495844) {
            return true;
          }
        }
      }
    }
    else {
      local_64 = (uint)*(ushort *)((long)pBytecode + 0x14);
      local_68[0] = '\x01';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      _msg.field_2._8_8_ = pBytecode;
      FormatString<char[64],unsigned_int,char[8],unsigned_int,char[13]>
                ((string *)local_60,
                 (Diligent *)"Unable to parse DXIL container: the container major version is ",
                 (char (*) [64])&local_64,(uint *)0xe3fac9,(char (*) [8])local_68,(uint *)0xe69937,
                 in_stack_ffffffffffffff68);
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar4 = (code *)DebugMessageCallback;
        uVar3 = std::__cxx11::string::c_str();
        (*pcVar4)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return false;
}

Assistant:

bool IsDXILBytecode(const void* pBytecode, size_t Size)
{
    const uint8_t* data_begin = static_cast<const uint8_t*>(pBytecode);
    const uint8_t* data_end   = data_begin + Size;
    const uint8_t* ptr        = data_begin;

    if (ptr + sizeof(hlsl::DxilContainerHeader) > data_end)
    {
        // No space for the container header
        return false;
    }

    // A DXIL container is composed of a header, a sequence of part lengths, and a sequence of parts.
    // https://github.com/microsoft/DirectXShaderCompiler/blob/master/docs/DXIL.rst#dxil-container-format
    const hlsl::DxilContainerHeader& ContainerHeader = *reinterpret_cast<const hlsl::DxilContainerHeader*>(ptr);
    if (ContainerHeader.HeaderFourCC != hlsl::DFCC_Container)
    {
        // Incorrect FourCC
        return false;
    }

    if (ContainerHeader.Version.Major != hlsl::DxilContainerVersionMajor)
    {
        LOG_WARNING_MESSAGE("Unable to parse DXIL container: the container major version is ", Uint32{ContainerHeader.Version.Major},
                            " while ", Uint32{hlsl::DxilContainerVersionMajor}, " is expected");
        return false;
    }

    // The header is followed by uint32_t PartOffset[PartCount];
    // The offset is to a DxilPartHeader.
    ptr += sizeof(hlsl::DxilContainerHeader);
    if (ptr + sizeof(uint32_t) * ContainerHeader.PartCount > data_end)
    {
        // No space for offsets
        return false;
    }

    const uint32_t* PartOffsets = reinterpret_cast<const uint32_t*>(ptr);
    for (uint32_t part = 0; part < ContainerHeader.PartCount; ++part)
    {
        const uint32_t Offset = PartOffsets[part];
        if (data_begin + Offset + sizeof(hlsl::DxilPartHeader) > data_end)
        {
            // No space for the part header
            return false;
        }

        const hlsl::DxilPartHeader& PartHeader = *reinterpret_cast<const hlsl::DxilPartHeader*>(data_begin + Offset);
        if (PartHeader.PartFourCC == hlsl::DFCC_DXIL)
        {
            // We found DXIL part
            return true;
        }
    }

    return false;
}